

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::setSimplexOptions(HEkk *this)

{
  HighsOptions *pHVar1;
  
  pHVar1 = this->options_;
  (this->info_).dual_edge_weight_strategy =
       (pHVar1->super_HighsOptionsStruct).simplex_dual_edge_weight_strategy;
  (this->info_).price_strategy = (pHVar1->super_HighsOptionsStruct).simplex_price_strategy;
  (this->info_).dual_simplex_cost_perturbation_multiplier =
       (pHVar1->super_HighsOptionsStruct).dual_simplex_cost_perturbation_multiplier;
  (this->info_).primal_simplex_bound_perturbation_multiplier =
       (pHVar1->super_HighsOptionsStruct).primal_simplex_bound_perturbation_multiplier;
  (this->info_).factor_pivot_threshold = (pHVar1->super_HighsOptionsStruct).factor_pivot_threshold;
  (this->info_).update_limit = (pHVar1->super_HighsOptionsStruct).simplex_update_limit;
  HighsRandom::initialise(&this->random_,(pHVar1->super_HighsOptionsStruct).random_seed);
  (this->info_).store_squared_primal_infeasibility = true;
  return;
}

Assistant:

void HEkk::setSimplexOptions() {
  // Copy values of HighsOptions for the simplex solver
  // Currently most of these options are straight copies, but they
  // will become valuable when "choose" becomes a HiGHS strategy value
  // that will need converting into a specific simplex strategy value.
  //
  // NB simplex_strategy is set by chooseSimplexStrategyThreads in each call
  //
  info_.dual_edge_weight_strategy = options_->simplex_dual_edge_weight_strategy;
  info_.price_strategy = options_->simplex_price_strategy;
  info_.dual_simplex_cost_perturbation_multiplier =
      options_->dual_simplex_cost_perturbation_multiplier;
  info_.primal_simplex_bound_perturbation_multiplier =
      options_->primal_simplex_bound_perturbation_multiplier;
  info_.factor_pivot_threshold = options_->factor_pivot_threshold;
  info_.update_limit = options_->simplex_update_limit;
  random_.initialise(options_->random_seed);

  // Set values of internal options
  info_.store_squared_primal_infeasibility = true;
}